

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser_traits.h
# Opt level: O0

StatusOr<long> __thiscall
google::protobuf::json_internal::UnparseProto3Type::GetInt64
          (UnparseProto3Type *this,Field f,Msg *msg,size_t idx)

{
  int32_t field_number;
  Field *this_00;
  reference u;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 extraout_RDX;
  StatusOr<long> SVar1;
  Span<const_long> local_38;
  size_t local_28;
  size_t idx_local;
  Msg *msg_local;
  Field f_local;
  
  local_28 = idx;
  idx_local = (size_t)msg;
  msg_local = (Msg *)f;
  f_local = (Field)this;
  this_00 = ResolverPool::Field::proto(f);
  field_number = Field::number(this_00);
  local_38 = UntypedMessage::Get<long>(msg,field_number);
  u = absl::lts_20240722::Span<const_long>::operator[](&local_38,local_28);
  absl::lts_20240722::StatusOr<long>::StatusOr<const_long_&,_0>((StatusOr<long> *)this,u);
  SVar1.super_StatusOrData<long>.field_1.data_ = extraout_RDX.data_;
  SVar1.super_StatusOrData<long>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)this;
  return (StatusOr<long>)SVar1.super_StatusOrData<long>;
}

Assistant:

static absl::StatusOr<int64_t> GetInt64(Field f, const Msg& msg,
                                          size_t idx = 0) {
    return msg.Get<int64_t>(f->proto().number())[idx];
  }